

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uitercollationiterator.cpp
# Opt level: O2

uint32_t __thiscall
icu_63::FCDUIterCollationIterator::handleNextCE32
          (FCDUIterCollationIterator *this,UChar32 *c,UErrorCode *errorCode)

{
  short sVar1;
  State SVar2;
  int offset;
  UTrie2 *pUVar3;
  UBool UVar4;
  char16_t cVar5;
  UChar32 UVar6;
  int iVar7;
  
  do {
    while (SVar2 = this->state, SVar2 == ITER_IN_FCD_SEGMENT) {
      if (this->pos != this->limit) {
        UVar6 = (*(code *)((this->super_UIterCollationIterator).iter)->next)();
        *c = UVar6;
        this->pos = this->pos + 1;
        goto LAB_002281ac;
      }
LAB_0022816a:
      switchToForward(this);
    }
    if (SVar2 != ITER_CHECK_FWD) {
      if (2 < (int)SVar2) {
        sVar1 = (this->normalized).fUnion.fStackFields.fLengthAndFlags;
        if (sVar1 < 0) {
          iVar7 = (this->normalized).fUnion.fFields.fLength;
        }
        else {
          iVar7 = (int)sVar1 >> 5;
        }
        offset = this->pos;
        if (offset != iVar7) {
          this->pos = offset + 1;
          cVar5 = UnicodeString::doCharAt(&this->normalized,offset);
          *c = (uint)(ushort)cVar5;
          goto LAB_002281ac;
        }
      }
      goto LAB_0022816a;
    }
    UVar6 = (*(code *)((this->super_UIterCollationIterator).iter)->next)();
    *c = UVar6;
    if (UVar6 < 0) {
      return 0xc0;
    }
    UVar4 = CollationFCD::hasTccc(UVar6);
    if (UVar4 == '\0') {
LAB_002281ac:
      pUVar3 = (this->super_UIterCollationIterator).super_CollationIterator.trie;
      return pUVar3->data32[(*c & 0x1fU) + (uint)pUVar3->index[*c >> 5] * 4];
    }
    if ((*c & 0x1fff01U) != 0xf01) {
      UVar6 = (*(code *)((this->super_UIterCollationIterator).iter)->current)();
      UVar4 = CollationFCD::hasLccc(UVar6);
      if (UVar4 == '\0') goto LAB_002281ac;
    }
    (*(code *)((this->super_UIterCollationIterator).iter)->previous)();
    UVar4 = nextSegment(this,errorCode);
    if (UVar4 == '\0') {
      *c = -1;
      return 0xc0;
    }
  } while( true );
}

Assistant:

uint32_t
FCDUIterCollationIterator::handleNextCE32(UChar32 &c, UErrorCode &errorCode) {
    for(;;) {
        if(state == ITER_CHECK_FWD) {
            c = iter.next(&iter);
            if(c < 0) {
                return Collation::FALLBACK_CE32;
            }
            if(CollationFCD::hasTccc(c)) {
                if(CollationFCD::maybeTibetanCompositeVowel(c) ||
                        CollationFCD::hasLccc(iter.current(&iter))) {
                    iter.previous(&iter);
                    if(!nextSegment(errorCode)) {
                        c = U_SENTINEL;
                        return Collation::FALLBACK_CE32;
                    }
                    continue;
                }
            }
            break;
        } else if(state == ITER_IN_FCD_SEGMENT && pos != limit) {
            c = iter.next(&iter);
            ++pos;
            U_ASSERT(c >= 0);
            break;
        } else if(state >= IN_NORM_ITER_AT_LIMIT && pos != normalized.length()) {
            c = normalized[pos++];
            break;
        } else {
            switchToForward();
        }
    }
    return UTRIE2_GET32_FROM_U16_SINGLE_LEAD(trie, c);
}